

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

string * L_O_G_NS_GET_TIME::get_time_abi_cxx11_(void)

{
  long lVar1;
  tm *ptVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  string *in_RDI;
  _Put_time<char> __f;
  time_t time;
  stringstream ss;
  basic_ostream<char,_std::char_traits<char>_> local_198 [376];
  
  lVar1 = std::chrono::_V2::system_clock::now();
  time = lVar1 / 1000000000;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  ptVar2 = localtime(&time);
  __f._M_fmt = "%Y-%m-%d %H:%M:%S";
  __f._M_tmb = (tm *)ptVar2;
  pbVar3 = std::operator<<(local_198,__f);
  poVar4 = std::operator<<((ostream *)pbVar3,'.');
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
  poVar4 = std::operator<<(poVar4,0x30);
  std::ostream::_M_insert<long>((long)poVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return in_RDI;
}

Assistant:

static inline std::string get_time() {
  auto now = std::chrono::system_clock::now();
  std::time_t time = std::chrono::system_clock::to_time_t(now);
  auto ms = std::chrono::duration_cast<std::chrono::milliseconds>(now.time_since_epoch()) % 1000;
  std::stringstream ss;
  ss << std::put_time(std::localtime(&time), "%Y-%m-%d %H:%M:%S") << '.' << std::setw(3) << std::setfill('0') << ms.count();
  return ss.str();
}